

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeForwardSubsumptionAndResolution.cpp
# Opt level: O0

bool __thiscall
Inferences::CodeTreeForwardSubsumptionAndResolution::perform
          (CodeTreeForwardSubsumptionAndResolution *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  SingletonIterator<Kernel::Clause_*> it;
  uint uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  ProofExtra PVar6;
  Clause *this_00;
  InferenceExtra *extra;
  undefined8 *in_RDX;
  Clause *this_01;
  Clause *in_RSI;
  long in_RDI;
  SingletonIterator<Kernel::Clause_*> SVar7;
  uint i;
  LiteralStack res;
  int resolvedQueryLit;
  Clause *premise;
  SimplifyingInference2 *in_stack_fffffffffffffeb8;
  ClauseMatcher *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffed0;
  ClauseMatcher *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  Clause *in_stack_fffffffffffffef8;
  Inference *in_stack_ffffffffffffff28;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff30;
  Inference local_b8;
  uint local_84;
  undefined1 local_60;
  Clause *local_58;
  uint local_44;
  Clause *local_40;
  undefined8 *local_20;
  Clause *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = Indexing::CodeTree::isEmpty(*(CodeTree **)(in_RDI + 0x18));
  if (bVar2) {
    local_1 = 0;
  }
  else {
    if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::cm ==
         '\0') &&
       (iVar4 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                     ::cm), iVar4 != 0)) {
      Indexing::ClauseCodeTree::ClauseMatcher::ClauseMatcher(in_stack_fffffffffffffee0);
      __cxa_atexit(Indexing::ClauseCodeTree::ClauseMatcher::~ClauseMatcher,&perform::cm,
                   &__dso_handle);
      __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                           ::cm);
    }
    Indexing::ClauseCodeTree::ClauseMatcher::init(&perform::cm,*(EVP_PKEY_CTX **)(in_RDI + 0x18));
    local_40 = Indexing::ClauseCodeTree::ClauseMatcher::next
                         ((ClauseMatcher *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    if (local_40 == (Clause *)0x0) {
      Indexing::ClauseCodeTree::ClauseMatcher::reset(in_stack_fffffffffffffec0);
      local_1 = 0;
    }
    else if (local_44 == 0xffffffff) {
      SVar7 = Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x794354);
      local_58 = SVar7._el;
      local_60 = SVar7._finished;
      it._el = in_stack_fffffffffffffef8;
      it._0_8_ = in_stack_fffffffffffffef0;
      Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it);
      Lib::VirtualIterator<Kernel::Clause_*>::operator=
                ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffed0,
                 (VirtualIterator<Kernel::Clause_*> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffec0);
      *(int *)(DAT_01333840 + 0x1b4) = *(int *)(DAT_01333840 + 0x1b4) + 1;
      Indexing::ClauseCodeTree::ClauseMatcher::reset(in_stack_fffffffffffffec0);
      local_1 = 1;
    }
    else {
      Lib::Stack<Kernel::Literal_*>::Stack
                (in_stack_fffffffffffffed0,
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      for (local_84 = 0; uVar1 = local_84, uVar5 = Kernel::Clause::length(local_18), uVar1 < uVar5;
          local_84 = local_84 + 1) {
        if (local_84 != local_44) {
          in_stack_fffffffffffffef8 = (Clause *)Kernel::Clause::operator[](local_18,local_84);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffec0,
                     (Literal *)in_stack_fffffffffffffeb8);
        }
      }
      Kernel::SimplifyingInference2::SimplifyingInference2
                ((SimplifyingInference2 *)&stack0xffffffffffffff30,SUBSUMPTION_RESOLUTION,local_18,
                 local_40);
      Kernel::Inference::Inference((Inference *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8)
      ;
      this_00 = Kernel::Clause::fromStack(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      *local_20 = this_00;
      Kernel::Inference::~Inference(&local_b8);
      PVar6 = Shell::Options::proofExtra(Lib::env);
      if (PVar6 == FULL) {
        extra = (InferenceExtra *)::operator_new(0x10);
        in_stack_fffffffffffffed0 =
             (Stack<Kernel::Literal_*> *)Kernel::Clause::operator[](local_18,local_44);
        LiteralInferenceExtra::LiteralInferenceExtra
                  ((LiteralInferenceExtra *)in_stack_fffffffffffffec0,
                   (Literal *)in_stack_fffffffffffffeb8);
        Lib::ProofExtra::insert
                  ((ProofExtra *)this_00,(Unit *)CONCAT44(PVar6,in_stack_fffffffffffffee8),extra);
      }
      SVar7 = Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x794637);
      this_01 = SVar7._el;
      uVar3 = SVar7._finished;
      SVar7._el = in_stack_fffffffffffffef8;
      SVar7._0_8_ = this_00;
      Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(SVar7);
      Lib::VirtualIterator<Kernel::Clause_*>::operator=
                ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffed0,
                 (VirtualIterator<Kernel::Clause_*> *)CONCAT17(uVar3,in_stack_fffffffffffffec8));
      Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Clause_*> *)this_01);
      *(int *)(DAT_01333840 + 0x140) = *(int *)(DAT_01333840 + 0x140) + 1;
      Indexing::ClauseCodeTree::ClauseMatcher::reset((ClauseMatcher *)this_01);
      local_1 = 1;
      Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)this_01);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CodeTreeForwardSubsumptionAndResolution::perform(Clause *cl, Clause *&replacement, ClauseIterator &premises)
{
  if (_ct->isEmpty()) {
    return false;
  }

  static ClauseCodeTree::ClauseMatcher cm;

  cm.init(_ct, cl, _subsumptionResolution);

  Clause* premise;
  int resolvedQueryLit;

  while ((premise = cm.next(resolvedQueryLit))) {
    if (resolvedQueryLit == -1) {
      ASS(satSubs.checkSubsumption(premise, cl));
      premises = pvi(getSingletonIterator(premise));
      env.statistics->forwardSubsumed++;
      cm.reset();
      return true;
    }
    ASS(satSubs.checkSubsumptionResolutionWithLiteral(premise, cl, resolvedQueryLit));

    LiteralStack res;
    for (unsigned i = 0; i < cl->length(); i++) {
      if (i == (unsigned)resolvedQueryLit) {
        continue;
      }
      res.push((*cl)[i]);
    }
    replacement = Clause::fromStack(res, SimplifyingInference2(InferenceRule::SUBSUMPTION_RESOLUTION, cl, premise));
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new LiteralInferenceExtra((*cl)[resolvedQueryLit]));
    premises = pvi(getSingletonIterator(premise));
    env.statistics->forwardSubsumptionResolution++;
    cm.reset();
    return true;
  }

  cm.reset();
  return false;
}